

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

bool tinyusdz::is_identity(matrix4f *m)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  fVar1 = m->m[0][0];
  if (-1 < (int)fVar1) {
    uVar3 = (int)fVar1 + 0xc0800000;
    uVar4 = -uVar3;
    if (0 < (int)uVar3) {
      uVar4 = uVar3;
    }
    if (uVar4 < 2) {
      fVar1 = m->m[0][1];
      bVar2 = (uint)fVar1 < 2;
      if ((int)fVar1 < 0) {
        bVar2 = ABS(fVar1) == 0.0;
      }
      if (bVar2) {
        fVar1 = m->m[0][2];
        bVar2 = (uint)fVar1 < 2;
        if ((int)fVar1 < 0) {
          bVar2 = ABS(fVar1) == 0.0;
        }
        if (bVar2) {
          fVar1 = m->m[0][3];
          bVar2 = (uint)fVar1 < 2;
          if ((int)fVar1 < 0) {
            bVar2 = ABS(fVar1) == 0.0;
          }
          if (bVar2) {
            fVar1 = m->m[1][0];
            bVar2 = (uint)fVar1 < 2;
            if ((int)fVar1 < 0) {
              bVar2 = ABS(fVar1) == 0.0;
            }
            if ((bVar2) && (fVar1 = m->m[1][1], -1 < (int)fVar1)) {
              uVar3 = (int)fVar1 + 0xc0800000;
              uVar4 = -uVar3;
              if (0 < (int)uVar3) {
                uVar4 = uVar3;
              }
              if (uVar4 < 2) {
                fVar1 = m->m[1][2];
                bVar2 = (uint)fVar1 < 2;
                if ((int)fVar1 < 0) {
                  bVar2 = ABS(fVar1) == 0.0;
                }
                if (bVar2) {
                  fVar1 = m->m[1][3];
                  bVar2 = (uint)fVar1 < 2;
                  if ((int)fVar1 < 0) {
                    bVar2 = ABS(fVar1) == 0.0;
                  }
                  if (bVar2) {
                    fVar1 = m->m[2][0];
                    bVar2 = (uint)fVar1 < 2;
                    if ((int)fVar1 < 0) {
                      bVar2 = ABS(fVar1) == 0.0;
                    }
                    if (bVar2) {
                      fVar1 = m->m[2][1];
                      bVar2 = (uint)fVar1 < 2;
                      if ((int)fVar1 < 0) {
                        bVar2 = ABS(fVar1) == 0.0;
                      }
                      if ((bVar2) && (fVar1 = m->m[2][2], -1 < (int)fVar1)) {
                        uVar3 = (int)fVar1 + 0xc0800000;
                        uVar4 = -uVar3;
                        if (0 < (int)uVar3) {
                          uVar4 = uVar3;
                        }
                        if (uVar4 < 2) {
                          fVar1 = m->m[2][3];
                          bVar2 = (uint)fVar1 < 2;
                          if ((int)fVar1 < 0) {
                            bVar2 = ABS(fVar1) == 0.0;
                          }
                          if (bVar2) {
                            fVar1 = m->m[3][0];
                            bVar2 = (uint)fVar1 < 2;
                            if ((int)fVar1 < 0) {
                              bVar2 = ABS(fVar1) == 0.0;
                            }
                            if (bVar2) {
                              fVar1 = m->m[3][1];
                              bVar2 = (uint)fVar1 < 2;
                              if ((int)fVar1 < 0) {
                                bVar2 = ABS(fVar1) == 0.0;
                              }
                              if (bVar2) {
                                fVar1 = m->m[3][2];
                                bVar2 = (uint)fVar1 < 2;
                                if ((int)fVar1 < 0) {
                                  bVar2 = ABS(fVar1) == 0.0;
                                }
                                if ((bVar2) && (fVar1 = m->m[3][3], -1 < (int)fVar1)) {
                                  uVar3 = (int)fVar1 + 0xc0800000;
                                  uVar4 = -uVar3;
                                  if (0 < (int)uVar3) {
                                    uVar4 = uVar3;
                                  }
                                  return uVar4 < 2;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool is_identity(const value::matrix4f &m) {
  return math::almost_equals_by_ulps(m.m[0][0], 1.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[0][1], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[0][2], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[0][3], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[1][0], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[1][1], 1.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[1][2], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[1][3], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[2][0], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[2][1], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[2][2], 1.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[2][3], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[3][0], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[3][1], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[3][2], 0.0f, kIdentityMaxUlps) &&
         math::almost_equals_by_ulps(m.m[3][3], 1.0f, kIdentityMaxUlps);
}